

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isWellFormedAddress(XMLCh *addrString,XMLSize_t addrStrLen)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  XMLSize_t toSearchLen;
  
  if ((addrStrLen != 0) && (1 < (ushort)*addrString - 0x2d)) {
    if (*addrString == L'[') {
      bVar1 = isWellFormedIPv6Reference(addrString,addrStrLen);
      return bVar1;
    }
    if (addrString[addrStrLen - 1] != L'-') {
      iVar2 = XMLString::lastIndexOf(L'.',addrString,addrStrLen);
      toSearchLen = (XMLSize_t)iVar2;
      if ((long)(iVar2 + 1) == addrStrLen) {
        iVar2 = XMLString::lastIndexOf(L'.',addrString,toSearchLen);
        toSearchLen = (XMLSize_t)iVar2;
        bVar1 = XMLString::isDigit(addrString[toSearchLen + 1]);
        if (bVar1) {
          return false;
        }
      }
      bVar1 = XMLString::isDigit(addrString[toSearchLen + 1]);
      if (bVar1) {
        bVar1 = isWellFormedIPv4Address(addrString,addrStrLen);
        return bVar1;
      }
      uVar3 = 0;
      if (0xff < addrStrLen) {
        return false;
      }
      uVar4 = 1;
      do {
        if (addrString[uVar4 - 1] == L'.') {
          if ((uVar4 != 1) && (bVar1 = XMLString::isAlphaNum(addrString[uVar4 - 2]), !bVar1)) {
            return false;
          }
          uVar3 = 0;
          if (uVar4 < addrStrLen) {
            bVar1 = XMLString::isAlphaNum(addrString[uVar4]);
            uVar3 = 0;
            if (!bVar1) {
              return false;
            }
          }
        }
        else {
          bVar1 = XMLString::isAlphaNum(addrString[uVar4 - 1]);
          if (bVar1) {
            uVar3 = uVar3 + 1;
            if (0x3f < uVar3) {
              return false;
            }
          }
          else {
            if (addrString[uVar4 - 1] != L'-') {
              return false;
            }
            uVar3 = uVar3 + 1;
            if (0x3f < uVar3) {
              return false;
            }
          }
        }
        bVar1 = uVar4 == addrStrLen;
        uVar4 = uVar4 + 1;
        if (bVar1) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool XMLUri::isWellFormedAddress(const XMLCh* const addrString,
                                 const XMLSize_t addrStrLen)
{
    // Check that we have a non-zero length string.
    if (addrStrLen == 0)
        return false;

    // Check if the host is a valid IPv6reference.
    if (*addrString == chOpenSquare)
    {
        return isWellFormedIPv6Reference(addrString, addrStrLen);
    }

    //
    // Cannot start with a '.', '-', or end with a '-'.
    //
    if (*addrString == chPeriod ||
        *addrString == chDash ||
        addrString[addrStrLen-1] == chDash)
        return false;

    // rightmost domain label starting with digit indicates IP address
    // since top level domain label can only start with an alpha
    // see RFC 2396 Section 3.2.2

    int lastPeriodPos = XMLString::lastIndexOf(chPeriod, addrString, addrStrLen);

    // if the string ends with "."
    // get the second last "."
    if (XMLSize_t(lastPeriodPos + 1) == addrStrLen)
    {
        lastPeriodPos = XMLString::lastIndexOf(chPeriod, addrString, lastPeriodPos);

        if ( XMLString::isDigit(addrString[lastPeriodPos + 1]))
			return false;
    }

    if (XMLString::isDigit(addrString[lastPeriodPos + 1]))
    {
        return isWellFormedIPv4Address(addrString, addrStrLen);
    } // end of IPv4address
    else
    {
        //
        //  hostname      = *( domainlabel "." ) toplabel [ "." ]
        //  domainlabel   = alphanum | alphanum *( alphanum | "-" ) alphanum
        //  toplabel      = alpha | alpha *( alphanum | "-" ) alphanum

        // RFC 2396 states that hostnames take the form described in
        // RFC 1034 (Section 3) and RFC 1123 (Section 2.1). According
        // to RFC 1034, hostnames are limited to 255 characters.
        if (addrStrLen > 255) {
            return false;
        }

        unsigned int labelCharCount = 0;

        // domain labels can contain alphanumerics and '-"
        // but must start and end with an alphanumeric
        for (XMLSize_t i = 0; i < addrStrLen; i++)
        {
            if (addrString[i] == chPeriod)
            {
              if (((i > 0)  &&
                   (!XMLString::isAlphaNum(addrString[i-1]))) ||
                  ((i + 1 < addrStrLen) &&
                   (!XMLString::isAlphaNum(addrString[i+1])))  )
                {
                    return false;
                }
                labelCharCount = 0;
            }
            else if (!XMLString::isAlphaNum(addrString[i]) &&
                      addrString[i] != chDash)
            {
                return false;
            }
            // RFC 1034: Labels must be 63 characters or less.
            else if (++labelCharCount > 63) {
                return false;
            }
        } //for
    }

    return true;
}